

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetMaxGrowth(void *arkode_mem,sunrealtype mx_growth)

{
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  ARKodeMem in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8,(ARKodeHAdaptMem *)0x15c84a);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd0->step_supports_adaptive == 0) {
      arkProcessError(in_stack_ffffffffffffffd0,-0x30,0x723,"ARKodeSetMaxGrowth",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
      local_4 = -0x30;
    }
    else {
      if (1.0 < in_XMM0_Qa) {
        *(double *)((long)in_stack_ffffffffffffffd8 + 0x40) = in_XMM0_Qa;
      }
      else {
        *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x40) = 0x4034000000000000;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetMaxGrowth(void* arkode_mem, sunrealtype mx_growth)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* set allowed value, otherwise set default */
  if (mx_growth <= ONE) { hadapt_mem->growth = GROWTH; }
  else { hadapt_mem->growth = mx_growth; }

  return (ARK_SUCCESS);
}